

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int FreeEXRHeader(EXRHeader *exr_header)

{
  long in_RDI;
  int i;
  EXRHeader *unaff_retaddr;
  undefined4 local_14;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RDI == 0) {
    iVar1 = -3;
  }
  else {
    if (*(long *)(in_RDI + 0x68) != 0) {
      free(*(void **)(in_RDI + 0x68));
    }
    if (*(long *)(in_RDI + 0x70) != 0) {
      free(*(void **)(in_RDI + 0x70));
    }
    if (*(long *)(in_RDI + 0x80) != 0) {
      free(*(void **)(in_RDI + 0x80));
    }
    for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x5c); local_14 = local_14 + 1) {
      if (*(long *)(*(long *)(in_RDI + 0x60) + (long)local_14 * 0x210 + 0x200) != 0) {
        free(*(void **)(*(long *)(in_RDI + 0x60) + (long)local_14 * 0x210 + 0x200));
      }
    }
    if (*(long *)(in_RDI + 0x60) != 0) {
      free(*(void **)(in_RDI + 0x60));
    }
    EXRSetNameAttr(unaff_retaddr,
                   (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int FreeEXRHeader(EXRHeader *exr_header) {
  if (exr_header == NULL) {
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (exr_header->channels) {
    free(exr_header->channels);
  }

  if (exr_header->pixel_types) {
    free(exr_header->pixel_types);
  }

  if (exr_header->requested_pixel_types) {
    free(exr_header->requested_pixel_types);
  }

  for (int i = 0; i < exr_header->num_custom_attributes; i++) {
    if (exr_header->custom_attributes[i].value) {
      free(exr_header->custom_attributes[i].value);
    }
  }

  if (exr_header->custom_attributes) {
    free(exr_header->custom_attributes);
  }

  EXRSetNameAttr(exr_header, NULL);

  return TINYEXR_SUCCESS;
}